

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::IsLinkInterfaceDependentBoolProperty
          (cmGeneratorTarget *this,string *p,string *config)

{
  TargetType TVar1;
  CompatibleInterfacesBase *this_00;
  size_type sVar2;
  string *config_local;
  string *p_local;
  cmGeneratorTarget *this_local;
  
  TVar1 = GetType(this);
  if ((TVar1 != OBJECT_LIBRARY) && (TVar1 = GetType(this), TVar1 != INTERFACE_LIBRARY)) {
    this_00 = GetCompatibleInterfaces(this,config);
    sVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&this_00->PropsBool,p);
    return sVar2 != 0;
  }
  return false;
}

Assistant:

bool cmGeneratorTarget::IsLinkInterfaceDependentBoolProperty(
    const std::string &p, const std::string& config) const
{
  if (this->GetType() == cmState::OBJECT_LIBRARY
      || this->GetType() == cmState::INTERFACE_LIBRARY)
    {
    return false;
    }
  return this->GetCompatibleInterfaces(config).PropsBool.count(p) > 0;
}